

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_connect(connectdata *conn,_Bool *done)

{
  CURLcode CVar1;
  
  (conn->bits).close = false;
  CVar1 = Curl_proxy_connect(conn);
  if ((CVar1 == CURLE_OK) && (CVar1 = CURLE_OK, conn->tunnel_state[0] != TUNNEL_CONNECT)) {
    if ((conn->given->flags & 1) == 0) {
      *done = true;
    }
    else {
      CVar1 = CURLE_COULDNT_CONNECT;
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_http_connect(struct connectdata *conn, bool *done)
{
  CURLcode result;

  /* We default to persistent connections. We set this already in this connect
     function to make the re-use checks properly be able to check this bit. */
  connkeep(conn, "HTTP default");

  /* the CONNECT procedure might not have been completed */
  result = Curl_proxy_connect(conn);
  if(result)
    return result;

  if(conn->tunnel_state[FIRSTSOCKET] == TUNNEL_CONNECT)
    /* nothing else to do except wait right now - we're not done here. */
    return CURLE_OK;

  if(conn->given->flags & PROTOPT_SSL) {
    /* perform SSL initialization */
    result = https_connecting(conn, done);
    if(result)
      return result;
  }
  else
    *done = TRUE;

  return CURLE_OK;
}